

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_5::FormatFreeFieldNumbers
          (anon_unknown_5 *this,string_view name,
          btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          *ranges)

{
  bool bVar1;
  ostream *this_00;
  const_iterator cVar2;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355> local_e8;
  int local_d4;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355>
  local_d0;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355> local_c0;
  reference local_b0;
  pair<int,_int> *range;
  int local_a0;
  undefined1 local_98 [8];
  const_iterator __end3;
  undefined1 local_78 [8];
  const_iterator __begin3;
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *__range3;
  int next_free_number;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)524292> local_50;
  undefined1 local_40 [8];
  string output;
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *ranges_local;
  string_view name_local;
  
  output.field_2._8_8_ = name._M_str;
  name_local._M_len = name._M_len;
  ranges_local = (btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                  *)this;
  std::__cxx11::string::string((string *)local_40);
  absl::lts_20250127::str_format_internal::
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)524292>::FormatSpecTemplate
            (&local_50,"%-35s free:");
  absl::lts_20250127::StrAppendFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
            ((Nonnull<std::string_*>)local_40,&local_50,
             (basic_string_view<char,_std::char_traits<char>_> *)&ranges_local);
  __range3._0_4_ = 1;
  __begin3._8_8_ = output.field_2._8_8_;
  cVar2 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
          ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
                   *)output.field_2._8_8_);
  __end3._8_8_ = cVar2.node_;
  __begin3.node_._0_4_ = cVar2.position_;
  local_78 = (undefined1  [8])__end3._8_8_;
  cVar2 = absl::lts_20250127::container_internal::
          btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
                 *)__begin3._8_8_);
  range = (pair<int,_int> *)cVar2.node_;
  local_a0 = cVar2.position_;
  local_98 = (undefined1  [8])range;
  __end3.node_._0_4_ = local_a0;
  while (bVar1 = absl::lts_20250127::container_internal::
                 btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
                 ::operator!=((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
                               *)local_78,(const_iterator *)local_98), bVar1) {
    local_b0 = absl::lts_20250127::container_internal::
               btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
               ::operator*((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
                            *)local_78);
    if ((int)__range3 < local_b0->second) {
      if ((int)__range3 < local_b0->first) {
        if ((int)__range3 + 1 == local_b0->first) {
          absl::lts_20250127::str_format_internal::
          FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355>::
          FormatSpecTemplate(&local_c0," %d");
          absl::lts_20250127::StrAppendFormat<int>
                    ((Nonnull<std::string_*>)local_40,&local_c0,(int *)&__range3);
        }
        else {
          absl::lts_20250127::str_format_internal::
          FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355>
          ::FormatSpecTemplate(&local_d0," %d-%d");
          local_d4 = local_b0->first + -1;
          absl::lts_20250127::StrAppendFormat<int,_int>
                    ((Nonnull<std::string_*>)local_40,&local_d0,(int *)&__range3,&local_d4);
        }
      }
      __range3._0_4_ = local_b0->second;
    }
    absl::lts_20250127::container_internal::
    btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
    ::operator++((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
                  *)local_78);
  }
  if ((int)__range3 < 0x20000000) {
    absl::lts_20250127::str_format_internal::
    FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355>::FormatSpecTemplate
              (&local_e8," %d-INF");
    absl::lts_20250127::StrAppendFormat<int>
              ((Nonnull<std::string_*>)local_40,&local_e8,(int *)&__range3);
  }
  this_00 = std::operator<<((ostream *)&std::cout,(string *)local_40);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void FormatFreeFieldNumbers(absl::string_view name,
                            const absl::btree_set<FieldRange>& ranges) {
  std::string output;
  absl::StrAppendFormat(&output, "%-35s free:", name);
  int next_free_number = 1;
  for (const auto& range : ranges) {
    // This happens when groups re-use parent field numbers, in which
    // case we skip the FieldRange entirely.
    if (next_free_number >= range.second) continue;

    if (next_free_number < range.first) {
      if (next_free_number + 1 == range.first) {
        // Singleton
        absl::StrAppendFormat(&output, " %d", next_free_number);
      } else {
        // Range
        absl::StrAppendFormat(&output, " %d-%d", next_free_number,
                              range.first - 1);
      }
    }
    next_free_number = range.second;
  }
  if (next_free_number <= FieldDescriptor::kMaxNumber) {
    absl::StrAppendFormat(&output, " %d-INF", next_free_number);
  }
  std::cout << output << std::endl;
}